

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

intptr_t sysbvm_dictionary_scanFor
                   (sysbvm_context_t *context,sysbvm_dictionary_t **dictionary,
                   sysbvm_tuple_t *element)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  ulong local_78;
  size_t i_1;
  size_t i;
  size_t hashIndex;
  size_t capacity;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_ceb630cf gcFrame;
  sysbvm_tuple_t *element_local;
  sysbvm_dictionary_t **dictionary_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&capacity,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&capacity);
  sVar2 = sysbvm_tuple_getSizeInSlots((*dictionary)->storage);
  if (sVar2 == 0) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&capacity);
  }
  else {
    gcFrameRecord.roots = (sysbvm_tuple_t *)(*dictionary)->storage;
    sVar3 = sysbvm_tuple_hash(context,*element);
    for (i_1 = sVar3 % sVar2; i_1 < sVar2; i_1 = i_1 + 1) {
      if ((gcFrameRecord.roots[i_1 + 2] == 0) ||
         (_Var1 = sysbvm_tuple_equals(context,*element,
                                      *(sysbvm_tuple_t *)(gcFrameRecord.roots[i_1 + 2] + 0x10)),
         _Var1)) {
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&capacity);
        return i_1;
      }
    }
    for (local_78 = 0; local_78 < sVar3 % sVar2; local_78 = local_78 + 1) {
      if ((gcFrameRecord.roots[local_78 + 2] == 0) ||
         (_Var1 = sysbvm_tuple_equals(context,*element,
                                      *(sysbvm_tuple_t *)(gcFrameRecord.roots[local_78 + 2] + 0x10))
         , _Var1)) {
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&capacity);
        return local_78;
      }
    }
  }
  return -1;
}

Assistant:

static intptr_t sysbvm_dictionary_scanFor(sysbvm_context_t *context, sysbvm_dictionary_t **dictionary, sysbvm_tuple_t *element)
{
    struct {
        sysbvm_array_t *storage;
        sysbvm_association_t *association;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t capacity = sysbvm_tuple_getSizeInSlots((*dictionary)->storage);
    if(capacity == 0)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return -1;
    }

    gcFrame.storage = (sysbvm_array_t*)(*dictionary)->storage;
    size_t hashIndex = sysbvm_tuple_hash(context, *element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    return -1;
}